

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

string * __thiscall Query::as_string_repr_abi_cxx11_(string *__return_storage_ptr__,Query *this)

{
  pointer pQVar1;
  uint64_t uVar2;
  uint *in_R8;
  const_iterator __begin1;
  pointer this_00;
  string out;
  IndexType local_4c;
  _Alloc_hider local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"",(allocator<char> *)&local_4c);
  this_00 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar1 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == pQVar1) {
    local_4c = (this->ngram).itype;
    ::fmt::v6::format<char[10],int,unsigned_int_const&,char>
              (__return_storage_ptr__,(v6 *)"{}_{:06x}",(char (*) [10])&local_4c,
               (int *)&(this->ngram).trigram,in_R8);
  }
  else {
    for (; this_00 != pQVar1; this_00 = this_00 + 1) {
      uVar2 = QToken::num_possible_values(this_00);
      if (uVar2 == 1) {
        QToken::possible_values(this_00);
        std::__cxx11::string::push_back((char)&local_48);
      }
      else {
        std::__cxx11::string::append((char *)&local_48);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_48._M_p == &local_38) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
    }
    __return_storage_ptr__->_M_string_length = local_40;
    local_40 = 0;
    local_38 = '\0';
    local_48._M_p = &local_38;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Query::as_string_repr() const {
    std::string out = "";
    if (value.empty()) {
        // Query is already after planning stage. Show low-level representation.
        // First digit is the index type and the rest is the raw trigram.
        // Underscore was picked to make copying from terminal easier.
        return fmt::format("{}_{:06x}", (int)ngram.itype, ngram.trigram);
    }
    // No query plan yet. Show stringlike representation.
    for (const auto &token : value) {
        if (token.num_possible_values() == 1) {
            out += token.possible_values()[0];
        } else {
            out += "?";
        }
    }
    return out;
}